

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_reader.cpp
# Opt level: O0

int __thiscall argo::fd_reader::read_next_char(fd_reader *this)

{
  int iVar1;
  ssize_t sVar2;
  json_io_exception *pjVar3;
  int *piVar4;
  char local_19;
  int n;
  char buf [1];
  fd_reader *this_local;
  
  _n = this;
  sVar2 = read(*(int *)&(this->super_reader).field_0x202c,&local_19,1);
  iVar1 = (int)sVar2;
  if (iVar1 == 0) {
    this_local._4_4_ = -1;
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 == -1) {
        pjVar3 = (json_io_exception *)__cxa_allocate_exception(0xd8);
        piVar4 = __errno_location();
        json_io_exception::json_io_exception(pjVar3,read_failed_e,*piVar4);
        __cxa_throw(pjVar3,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
      }
      pjVar3 = (json_io_exception *)__cxa_allocate_exception(0xd8);
      json_io_exception::json_io_exception(pjVar3,unexpected_result_from_read_e);
      __cxa_throw(pjVar3,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
    }
    this_local._4_4_ = (int)local_19;
  }
  return this_local._4_4_;
}

Assistant:

int fd_reader::read_next_char()
{
    char buf[1];
    int n = read(m_fd, buf, 1);

    if (n == 0)
    {
        return EOF;
    }
    else if (n == 1)
    {
        return buf[0];
    }
    else if (n == -1)
    {
        throw json_io_exception(json_io_exception::read_failed_e, errno);
    }
    else
    {
        throw json_io_exception(json_io_exception::unexpected_result_from_read_e);
    }
}